

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

char * dmrC_show_pseudo(dmr_C *C,pseudo_t pseudo)

{
  pseudo_type pVar1;
  linearizer_state_t *plVar2;
  symbol *psVar3;
  expression *peVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  char *__format;
  char *pcVar8;
  
  if (pseudo == (pseudo_t)0x0) {
    return "no pseudo";
  }
  plVar2 = C->L;
  if (&plVar2->void_pseudo == pseudo) {
    return "VOID";
  }
  uVar7 = plVar2->n + 1;
  plVar2->n = uVar7;
  pcVar6 = plVar2->pseudo_buffer[0] + ((uVar7 & 3) << 6);
  pVar1 = pseudo->type;
  switch(pVar1) {
  case PSEUDO_REG:
    uVar7 = pseudo->nr;
    pcVar8 = "%%r%d";
    goto LAB_00129dd6;
  case PSEUDO_SYM:
    psVar3 = (pseudo->field_5).sym;
    if ((psVar3->field_15).bb_target == (basic_block *)0x0) {
      if (psVar3->ident == (ident *)0x0) {
        peVar4 = (psVar3->field_14).field_2.initializer;
        snprintf(pcVar6,0x40,"<anon symbol:%p>");
        if (peVar4 == (expression *)0x0) {
          return pcVar6;
        }
        if (*(char *)peVar4 == '\x02') {
          pcVar6 = dmrC_show_string(C,(peVar4->field_5).field_2.string);
          return pcVar6;
        }
        if (*(char *)peVar4 != '\x01') {
          return pcVar6;
        }
        pcVar8 = (char *)(peVar4->field_5).field_0.value;
        __format = "<symbol value: %lld>";
      }
      else {
        pcVar8 = dmrC_show_ident(C,psVar3->ident);
        __format = "%s";
      }
      goto LAB_00129e81;
    }
    pVar1 = ((psVar3->field_15).bb_target)->nr;
    pcVar8 = ".L%u";
    break;
  case PSEUDO_VAL:
    pcVar8 = (char *)(pseudo->field_5).value;
    if (pcVar8 + -0x3e9 < (char *)0xfffffffffffff82f) {
      __format = "$%#llx";
    }
    else {
      __format = "$%lld";
    }
LAB_00129e81:
    snprintf(pcVar6,0x40,__format,pcVar8);
    return pcVar6;
  case PSEUDO_ARG:
    pVar1 = pseudo->nr;
    pcVar8 = "%%arg%d";
    break;
  case PSEUDO_PHI:
    uVar7 = pseudo->nr;
    pcVar8 = "%%phi%d";
LAB_00129dd6:
    iVar5 = snprintf(pcVar6,0x40,pcVar8,(ulong)uVar7);
    if (pseudo->ident == (ident *)0x0) {
      return pcVar6;
    }
    pcVar8 = dmrC_show_ident(C,pseudo->ident);
    sprintf(pcVar6 + iVar5,"(%s)",pcVar8);
    return pcVar6;
  default:
    pcVar8 = "<bad pseudo type %d>";
  }
  snprintf(pcVar6,0x40,pcVar8,(ulong)pVar1);
  return pcVar6;
}

Assistant:

const char *dmrC_show_pseudo(struct dmr_C *C, pseudo_t pseudo)
{
	char *buf;
	int i;

	if (!pseudo)
		return "no pseudo";
	if (pseudo == VOID_PSEUDO(C))
		return "VOID";
	buf = C->L->pseudo_buffer[3 & ++C->L->n];
	switch(pseudo->type) {
	case PSEUDO_SYM: {
		struct symbol *sym = pseudo->sym;
		struct expression *expr;

		if (sym->bb_target) {
			snprintf(buf, 64, ".L%u", sym->bb_target->nr);
			break;
		}
		if (sym->ident) {
			snprintf(buf, 64, "%s", dmrC_show_ident(C, sym->ident));
			break;
		}
		expr = sym->initializer;
		snprintf(buf, 64, "<anon symbol:%p>", sym);
		if (expr) {
			switch (expr->type) {
			case EXPR_VALUE:
				snprintf(buf, 64, "<symbol value: %lld>", expr->value);
				break;
			case EXPR_STRING:
				return dmrC_show_string(C, expr->string);
			default:
				break;
			}
		}
		break;
	}
	case PSEUDO_REG:
		i = snprintf(buf, 64, "%%r%d", pseudo->nr);
		if (pseudo->ident)
			sprintf(buf+i, "(%s)", dmrC_show_ident(C, pseudo->ident));
		break;
	case PSEUDO_VAL: {
		long long value = pseudo->value;
		if (value > 1000 || value < -1000)
			snprintf(buf, 64, "$%#llx", value);
		else
			snprintf(buf, 64, "$%lld", value);
		break;
	}
	case PSEUDO_ARG:
		snprintf(buf, 64, "%%arg%d", pseudo->nr);
		break;
	case PSEUDO_PHI:
		i = snprintf(buf, 64, "%%phi%d", pseudo->nr);
		if (pseudo->ident)
			sprintf(buf+i, "(%s)", dmrC_show_ident(C, pseudo->ident));
		break;
	default:
		snprintf(buf, 64, "<bad pseudo type %d>", pseudo->type);
	}
	return buf;
}